

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

void Au_ManReorderModels(Au_Man_t *p,Au_Ntk_t *pRoot)

{
  uint uVar1;
  int *__ptr;
  long lVar2;
  void **ppvVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  uint *__ptr_00;
  void *pvVar8;
  void *pvVar9;
  uint *__ptr_01;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong *puVar19;
  int iVar20;
  ulong uVar21;
  
  uVar6 = (ulong)(p->vNtks).nSize;
  if (1 < (long)uVar6) {
    uVar1 = (p->vNtks).nSize;
    uVar11 = 1;
    if (1 < (int)uVar1) {
      uVar11 = (ulong)uVar1;
    }
    uVar14 = 1;
    do {
      if (uVar11 == uVar14) goto LAB_001d5f5f;
      *(undefined4 *)((long)(p->vNtks).pArray[uVar14] + 200) = 0;
      uVar14 = uVar14 + 1;
    } while (uVar6 != uVar14);
  }
  iVar13 = (p->vNtks).nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar20 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar20 = iVar13;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar20;
  if (iVar20 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar20 << 2);
  }
  p_00->pArray = piVar7;
  Vec_IntPush(p_00,0);
  Au_ManReorderModels_rec(pRoot,p_00);
  iVar13 = p_00->nSize;
  if ((long)iVar13 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  if (p_00->pArray[(long)iVar13 + -1] != pRoot->Id) {
    __assert_fail("Vec_IntEntryLast(vOrder) == pRoot->Id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                  ,0x1b7,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
  }
  p_00->nSize = iVar13 + -1;
  if (1 < (p->vNtks).nSize) {
    lVar16 = 1;
    do {
      if ((p->vNtks).nSize <= lVar16) goto LAB_001d5f5f;
      pvVar8 = (p->vNtks).pArray[lVar16];
      if (*(int *)((long)pvVar8 + 200) == 0) {
        Vec_IntPush(p_00,*(int *)((long)pvVar8 + 0x10));
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (p->vNtks).nSize);
  }
  Vec_IntPush(p_00,pRoot->Id);
  uVar1 = p_00->nSize;
  uVar6 = (ulong)uVar1;
  if (uVar1 != (p->vNtks).nSize) {
    __assert_fail("Vec_IntSize(vOrder) == Au_ManNtkNum(p)+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                  ,0x1be,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
  }
  p_00->nSize = uVar1 - 1;
  __ptr = p_00->pArray;
  piVar7 = __ptr + 1;
  p_00->pArray = piVar7;
  if (2 < (int)uVar1) {
    uVar12 = (int)(uVar1 - 1) / 2;
    uVar11 = 1;
    if (1 < (int)uVar12) {
      uVar11 = (ulong)uVar12;
    }
    iVar13 = uVar1 - 2;
    uVar14 = 0;
    do {
      iVar20 = piVar7[uVar14];
      piVar7[uVar14] = piVar7[iVar13];
      piVar7[iVar13] = iVar20;
      uVar14 = uVar14 + 1;
      iVar13 = iVar13 + -1;
    } while (uVar11 != uVar14);
  }
  p_00->pArray = __ptr;
  p_00->nSize = uVar1;
  uVar12 = (p->vNtks).nSize;
  __ptr_00 = (uint *)malloc(0x10);
  uVar10 = 8;
  if (6 < uVar12 - 1) {
    uVar10 = uVar12;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = uVar10;
  if (uVar10 == 0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = malloc((long)(int)uVar10 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar8;
  if (0 < (int)uVar1) {
    uVar11 = 0;
    do {
      iVar13 = __ptr[uVar11];
      if (((long)iVar13 < 0) || ((p->vNtks).nSize <= iVar13)) goto LAB_001d5f5f;
      pvVar8 = (p->vNtks).pArray[iVar13];
      uVar12 = __ptr_00[1];
      uVar10 = *__ptr_00;
      if (uVar12 == uVar10) {
        if ((int)uVar10 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar9 = malloc(0x80);
          }
          else {
            pvVar9 = realloc(*(void **)(__ptr_00 + 2),0x80);
          }
          uVar15 = 0x10;
        }
        else {
          uVar15 = uVar10 * 2;
          if ((int)uVar15 <= (int)uVar10) goto LAB_001d5a8b;
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar9 = malloc((ulong)uVar10 << 4);
          }
          else {
            pvVar9 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar10 << 4);
          }
        }
        *(void **)(__ptr_00 + 2) = pvVar9;
        *__ptr_00 = uVar15;
      }
LAB_001d5a8b:
      __ptr_00[1] = uVar12 + 1;
      *(void **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar12 * 8) = pvVar8;
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  if (1 < (int)uVar1) {
    if (__ptr[1] != pRoot->Id) {
      __assert_fail("Vec_IntEntry(vOrder, 1) == pRoot->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                    ,0x1ca,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
    }
    __ptr_01 = (uint *)malloc(0x10);
    __ptr_01[0] = 0;
    __ptr_01[1] = 0;
    __ptr_01[2] = 0;
    __ptr_01[3] = 0;
    iVar13 = *__ptr;
    uVar11 = 1;
    do {
      iVar20 = __ptr[uVar11];
      if (__ptr[uVar11] < iVar13) {
        iVar20 = iVar13;
      }
      iVar13 = iVar20;
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
    uVar1 = iVar13 + 1;
    if (-1 < iVar13) {
      pvVar8 = malloc((ulong)uVar1 << 2);
      *(void **)(__ptr_01 + 2) = pvVar8;
      if (pvVar8 == (void *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      *__ptr_01 = uVar1;
      memset(pvVar8,0,(ulong)uVar1 << 2);
    }
    __ptr_01[1] = uVar1;
    lVar16 = 0;
    do {
      uVar1 = __ptr[lVar16];
      if ((ulong)uVar1 != 0) {
        if (((int)uVar1 < 0) || (iVar13 < (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(int *)(*(long *)(__ptr_01 + 2) + (ulong)uVar1 * 4) = (int)lVar16;
      }
      lVar16 = lVar16 + 1;
    } while (uVar6 + (uVar6 == 0) != lVar16);
    free(__ptr);
    p_00->pArray = (int *)0x0;
    free(p_00);
    uVar1 = __ptr_01[1];
    if (1 < (int)uVar1) {
      pvVar8 = *(void **)(__ptr_01 + 2);
      if (*(int *)((long)pvVar8 + 4) != pRoot->Id) {
        __assert_fail("Vec_IntEntry(vOrder, 1) == pRoot->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                      ,0x1cd,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
      }
      if (1 < (p->vNtks).nSize) {
        lVar16 = 1;
        do {
          if ((p->vNtks).nSize <= lVar16) goto LAB_001d5f5f;
          pvVar9 = (p->vNtks).pArray[lVar16];
          if (uVar1 <= *(uint *)((long)pvVar9 + 0x10)) goto LAB_001d5f40;
          *(undefined4 *)((long)pvVar9 + 0x10) =
               *(undefined4 *)((long)pvVar8 + (ulong)*(uint *)((long)pvVar9 + 0x10) * 4);
          if (0 < *(int *)((long)pvVar9 + 0x3c)) {
            lVar18 = 0;
            do {
              if (*(int *)((long)pvVar9 + 0x3c) <= lVar18) goto LAB_001d5f40;
              uVar12 = *(uint *)(*(long *)((long)pvVar9 + 0x40) + lVar18 * 4);
              lVar2 = *(long *)(*(long *)((long)pvVar9 + 0x78) + (long)((int)uVar12 >> 0xc) * 8);
              uVar11 = (ulong)((uVar12 & 0xfff) << 4);
              uVar6 = *(ulong *)(lVar2 + uVar11);
              if ((uVar6 & 0x700000000) == 0x600000000) {
                if ((int)uVar1 <= (int)((uint)uVar6 & 0x3fffffff)) goto LAB_001d5f40;
                puVar19 = (ulong *)(lVar2 + uVar11);
                uVar11 = (ulong)(*(uint *)((long)pvVar8 + (ulong)((uint)uVar6 * 4)) & 0x3fffffff);
                *puVar19 = uVar6 & 0xfffffffec0000000 | uVar11;
                if (uVar11 == 0) {
                  __assert_fail("pBox->Func > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                                ,0x1d5,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
                }
                uVar6 = *puVar19;
                if ((uVar6 & 0x700000000) != 0x600000000) {
LAB_001d5f21:
                  __assert_fail("Au_ObjIsBox(p)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                                ,0xb5,"int Au_BoxFanoutNum(Au_Obj_t *)");
                }
                iVar13 = 0;
                while (iVar13 < *(int *)((long)puVar19 + (uVar6 >> 0x23) * 4 + 8)) {
                  iVar20 = (uint)(uVar6 >> 0x23) + iVar13;
                  iVar13 = iVar13 + 1;
                  uVar12 = *(uint *)((long)puVar19 + (ulong)(iVar20 + 1) * 4 + 8);
                  lVar2 = *(long *)(*(long *)(*(long *)((long)puVar19 -
                                                       (ulong)((uint)puVar19 & 0x3ff)) + 0x78) +
                                   (long)((int)uVar12 >> 0xc) * 8);
                  uVar11 = (ulong)((uVar12 & 0xfff) << 4);
                  *(ulong *)(lVar2 + uVar11) =
                       *(ulong *)(lVar2 + uVar11) & 0xffffffffc0000000 |
                       (ulong)((uint)uVar6 & 0x3fffffff);
                  uVar6 = *puVar19;
                  if ((uVar6 & 0x700000000) != 0x600000000) goto LAB_001d5f21;
                }
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < *(int *)((long)pvVar9 + 0x3c));
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < (p->vNtks).nSize);
      }
      ppvVar3 = (p->vNtks).pArray;
      if (ppvVar3 != (void **)0x0) {
        free(ppvVar3);
        (p->vNtks).pArray = (void **)0x0;
      }
      ppvVar3 = *(void ***)(__ptr_00 + 2);
      (p->vNtks).pArray = ppvVar3;
      __ptr_00[2] = 0;
      __ptr_00[3] = 0;
      free(__ptr_00);
      uVar6 = (ulong)(p->vNtks).nSize;
      if (1 < (long)uVar6) {
        uVar1 = (p->vNtks).nSize;
        uVar11 = 1;
        if (1 < (int)uVar1) {
          uVar11 = (ulong)uVar1;
        }
        uVar14 = 1;
        do {
          if (uVar14 == uVar11) {
LAB_001d5f5f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar9 = ppvVar3[uVar14];
          if (0 < (long)*(int *)((long)pvVar9 + 0x3c)) {
            uVar1 = *(uint *)((long)pvVar9 + 0x3c);
            if ((int)*(uint *)((long)pvVar9 + 0x3c) < 1) {
              uVar1 = 0;
            }
            uVar17 = 0;
            do {
              if (uVar1 == uVar17) goto LAB_001d5f40;
              uVar12 = *(uint *)(*(long *)((long)pvVar9 + 0x40) + uVar17 * 4);
              lVar16 = *(long *)(*(long *)((long)pvVar9 + 0x78) + (long)((int)uVar12 >> 0xc) * 8);
              uVar21 = (ulong)((uVar12 & 0xfff) << 4);
              uVar4 = *(ulong *)(lVar16 + uVar21);
              if ((uVar4 & 0x700000000) == 0x600000000) {
                uVar21 = lVar16 + uVar21;
                lVar16 = *(long *)(*(long *)(uVar21 & 0xfffffffffffffc00) + 8);
                uVar12 = (uint)uVar4 & 0x3fffffff;
                if (*(int *)(lVar16 + 0xc) <= (int)uVar12) goto LAB_001d5f5f;
                pvVar5 = *(void **)(*(long *)(lVar16 + 0x10) + (ulong)((uint)uVar4 & 0x3fffffff) * 8
                                   );
                if ((pvVar5 != (void *)0x0) && (pvVar5 != pvVar9)) {
                  if (((uVar4 & 0x3fffffff) != 0) && (uVar12 < *(uint *)((long)pvVar9 + 0x10))) {
                    __assert_fail("!pBox->Func || pBox->Func >= (unsigned)pNtk->Id",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                                  ,0x1e6,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
                  }
                  if (*(uint *)((long)pvVar5 + 0x50) != (uint)(uVar4 >> 0x23)) {
                    __assert_fail("Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                                  ,0x1e7,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
                  }
                  if (*(int *)(uVar21 + 8 + (uVar4 >> 0x23) * 4) != *(int *)((long)pvVar5 + 0x54)) {
                    __assert_fail("Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                                  ,0x1e8,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
                  }
                }
              }
              uVar17 = uVar17 + 1;
            } while ((long)*(int *)((long)pvVar9 + 0x3c) != uVar17);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar6);
      }
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
        __ptr_01[2] = 0;
        __ptr_01[3] = 0;
      }
      if (__ptr_01 != (uint *)0x0) {
        free(__ptr_01);
        return;
      }
      return;
    }
  }
LAB_001d5f40:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Au_ManReorderModels( Au_Man_t * p, Au_Ntk_t * pRoot )
{
    Vec_Ptr_t * vNtksNew;
    Vec_Int_t * vOrder, * vTemp;
    Au_Ntk_t * pNtk, * pBoxModel;
    Au_Obj_t * pBox, * pFan;
    int i, k, j, Entry;
    Au_ManForEachNtk( p, pNtk, i )
        pNtk->fMark = 0;
    // collect networks in the DFS order
    vOrder = Vec_IntAlloc( Au_ManNtkNum(p)+1 );
    Vec_IntPush( vOrder, 0 );
    Au_ManReorderModels_rec( pRoot, vOrder );
    assert( Vec_IntEntryLast(vOrder) == pRoot->Id );
    // add unconnected ones
    Vec_IntPop( vOrder );
    Au_ManForEachNtk( p, pNtk, i )
        if ( pNtk->fMark == 0 )
            Vec_IntPush( vOrder, pNtk->Id );
    Vec_IntPush( vOrder, pRoot->Id );
    assert( Vec_IntSize(vOrder) == Au_ManNtkNum(p)+1 );
    // reverse order
    vOrder->nSize--;
    vOrder->pArray++;
    Vec_IntReverseOrder( vOrder ); 
    vOrder->pArray--;
    vOrder->nSize++;
    // compute new order
    vNtksNew = Vec_PtrAlloc( Au_ManNtkNum(p)+1 );
    Vec_IntForEachEntry( vOrder, Entry, i )
        Vec_PtrPush( vNtksNew, Au_ManNtk(p, Entry) );
    // invert order
    assert( Vec_IntEntry(vOrder, 1) == pRoot->Id );
    vOrder = Vec_IntInvert( vTemp = vOrder, 0 );
    Vec_IntFree( vTemp );
    assert( Vec_IntEntry(vOrder, 1) == pRoot->Id );
    // update model numbers
    Au_ManForEachNtk( p, pNtk, i )
    {
        pNtk->Id = Vec_IntEntry( vOrder, pNtk->Id );
        Au_NtkForEachBox( pNtk, pBox, k )
        {
            pBox->Func = Vec_IntEntry( vOrder, pBox->Func );
            assert( pBox->Func > 0 );
            Au_BoxForEachFanout( pBox, pFan, j )
                pFan->Func = pBox->Func;
        }
    }
    // update
    ABC_FREE( p->vNtks.pArray );
    p->vNtks.pArray = vNtksNew->pArray;
    vNtksNew->pArray = NULL;
    Vec_PtrFree( vNtksNew );
    // verify
    Au_ManForEachNtk( p, pNtk, i )
        Au_NtkForEachBox( pNtk, pBox, k )
        {
            pBoxModel = Au_ObjModel(pBox);
            if ( pBoxModel == NULL || pBoxModel == pNtk )
                continue;
            assert( !pBox->Func || pBox->Func >= (unsigned)pNtk->Id );
            assert( Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel) );
            assert( Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel) );
        }
    Vec_IntFree( vOrder );
}